

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParsingPath.cpp
# Opt level: O3

string * __thiscall
PDFParsingPath::PrintPath_abi_cxx11_(string *__return_storage_ptr__,PDFParsingPath *this)

{
  _List_node_base *p_Var1;
  stringstream pathWriter;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  p_Var1 = (this->mObjectsPath).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)this) {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    while (p_Var1 = (((ObjectIDTypeList *)&p_Var1->_M_next)->
                    super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node
                    .super__List_node_base._M_next, p_Var1 != (_List_node_base *)this) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string PDFParsingPath::PrintPath() {
	std::stringstream pathWriter;
    ObjectIDTypeList::iterator it = mObjectsPath.begin();
	
    if(it != mObjectsPath.end()) {
        pathWriter<<*it;
        ++it;
        for(; it != mObjectsPath.end(); ++it) {
            pathWriter<<", "<<*it;
        }
    }

    return pathWriter.str();
}